

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.h
# Opt level: O0

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::set_piece
          (SentencePieceText_SentencePiece *this,string *value)

{
  Arena *pAVar1;
  string *value_local;
  SentencePieceText_SentencePiece *this_local;
  
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
  pAVar1 = google::protobuf::MessageLite::GetArena(&this->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(&this->piece_,value,pAVar1);
  return;
}

Assistant:

inline void SentencePieceText_SentencePiece::set_piece(std::string&& value) {
  _has_bits_[0] |= 0x00000001u;
  piece_.Set(
    ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, ::std::move(value), GetArena());
  // @@protoc_insertion_point(field_set_rvalue:sentencepiece.SentencePieceText.SentencePiece.piece)
}